

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentTypeImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMDocumentTypeImpl::DOMDocumentTypeImpl
          (DOMDocumentTypeImpl *this,DOMDocument *ownerDoc,XMLCh *dtName,bool heap)

{
  DOMDocument *doc;
  XMLCh *pXVar1;
  DOMNamedNodeMapImpl *pDVar2;
  DOMNode *ownerNode;
  XMLMutexLock lock;
  XMLMutexLock XStack_48;
  DOMParentNode *local_40;
  DOMNodeImpl *local_38;
  
  (this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMDocumentTypeImpl_003fd168;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_003fd348;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_003fd378;
  (this->super_HasDOMChildImpl)._vptr_HasDOMChildImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_003fd3a8;
  local_38 = &this->fNode;
  ownerNode = &ownerDoc->super_DOMNode;
  if (ownerDoc == (DOMDocument *)0x0) {
    ownerNode = (DOMNode *)0x0;
  }
  DOMNodeImpl::DOMNodeImpl(local_38,(DOMNode *)this,ownerNode);
  DOMParentNode::DOMParentNode(&this->fParent,(DOMNode *)this,ownerDoc);
  local_40 = &this->fParent;
  DOMChildNode::DOMChildNode(&this->fChild);
  *(undefined8 *)((long)&this->fSystemId + 1) = 0;
  *(undefined8 *)((long)&this->fInternalSubset + 1) = 0;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fNotations = (DOMNamedNodeMapImpl *)0x0;
  this->fElements = (DOMNamedNodeMapImpl *)0x0;
  this->fName = (XMLCh *)0x0;
  this->fEntities = (DOMNamedNodeMapImpl *)0x0;
  this->fIsCreatedFromHeap = heap;
  if (ownerDoc == (DOMDocument *)0x0) {
    XMLMutexLock::XMLMutexLock(&XStack_48,sDocumentMutex);
    doc = sDocument;
    pXVar1 = DOMDocumentImpl::getPooledString
                       ((DOMDocumentImpl *)&sDocument[-1].super_DOMNode,dtName);
    this->fName = pXVar1;
    pDVar2 = (DOMNamedNodeMapImpl *)operator_new(0x618,doc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar2,(DOMNode *)this);
    this->fEntities = pDVar2;
    pDVar2 = (DOMNamedNodeMapImpl *)operator_new(0x618,doc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar2,(DOMNode *)this);
    this->fNotations = pDVar2;
    pDVar2 = (DOMNamedNodeMapImpl *)operator_new(0x618,doc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar2,(DOMNode *)this);
    this->fElements = pDVar2;
    XMLMutexLock::~XMLMutexLock(&XStack_48);
  }
  else {
    pXVar1 = DOMDocumentImpl::getPooledString((DOMDocumentImpl *)&ownerDoc[-1].super_DOMNode,dtName)
    ;
    this->fName = pXVar1;
    pDVar2 = (DOMNamedNodeMapImpl *)operator_new(0x618,ownerDoc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar2,(DOMNode *)this);
    this->fEntities = pDVar2;
    pDVar2 = (DOMNamedNodeMapImpl *)operator_new(0x618,ownerDoc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar2,(DOMNode *)this);
    this->fNotations = pDVar2;
    pDVar2 = (DOMNamedNodeMapImpl *)operator_new(0x618,ownerDoc);
    DOMNamedNodeMapImpl::DOMNamedNodeMapImpl(pDVar2,(DOMNode *)this);
    this->fElements = pDVar2;
  }
  return;
}

Assistant:

DOMDocumentTypeImpl::DOMDocumentTypeImpl(DOMDocument *ownerDoc,
                                   const XMLCh *dtName,
                                   bool heap)
    : fNode(this, ownerDoc),
    fParent(this, ownerDoc),
    fName(0),
    fEntities(0),
    fNotations(0),
    fElements(0),
    fPublicId(0),
    fSystemId(0),
    fInternalSubset(0),
    fIntSubsetReading(false),
    fIsCreatedFromHeap(heap)
{
    if (ownerDoc)
    {
        fName = ((DOMDocumentImpl *)ownerDoc)->getPooledString(dtName);
        fEntities = new (ownerDoc) DOMNamedNodeMapImpl(this);
        fNotations= new (ownerDoc) DOMNamedNodeMapImpl(this);
        fElements = new (ownerDoc) DOMNamedNodeMapImpl(this);
    }
    else
    {
        XMLMutexLock lock(sDocumentMutex);
        DOMDocument* doc = sDocument;
        fName = ((DOMDocumentImpl *)doc)->getPooledString(dtName);
        fEntities = new (doc) DOMNamedNodeMapImpl(this);
        fNotations= new (doc) DOMNamedNodeMapImpl(this);
        fElements = new (doc) DOMNamedNodeMapImpl(this);
    }
}